

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestEnd
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  bool bVar1;
  TestInfo *test_info_00;
  TestResult *this_00;
  long *streamable;
  undefined8 uVar2;
  TestInfo *in_RSI;
  char *in_stack_ffffffffffffffb8;
  TestResult *in_stack_ffffffffffffffc0;
  TestResult *in_stack_ffffffffffffffc8;
  string local_30 [32];
  TestInfo *local_10;
  
  local_10 = in_RSI;
  TestInfo::result(in_RSI);
  bVar1 = TestResult::Passed(in_stack_ffffffffffffffc0);
  if (bVar1) {
    ColoredPrintf(kGreen,"[       OK ] ");
  }
  else {
    TestInfo::result(local_10);
    bVar1 = TestResult::Skipped(in_stack_ffffffffffffffc0);
    if (bVar1) {
      ColoredPrintf(kGreen,"[  SKIPPED ] ");
    }
    else {
      ColoredPrintf(kRed,"[  FAILED  ] ");
    }
  }
  test_info_00 = (TestInfo *)TestInfo::test_suite_name((TestInfo *)0x1628a7);
  TestInfo::name((TestInfo *)0x1628b6);
  PrintTestName((char *)test_info_00,in_stack_ffffffffffffffb8);
  TestInfo::result(local_10);
  bVar1 = TestResult::Failed(in_stack_ffffffffffffffc8);
  if (bVar1) {
    PrintFullTestCommentIfPresent(test_info_00);
  }
  if ((FLAGS_gtest_print_time & 1) == 0) {
    printf("\n");
  }
  else {
    this_00 = TestInfo::result(local_10);
    streamable = (long *)TestResult::elapsed_time(this_00);
    StreamableToString<long>(streamable);
    uVar2 = std::__cxx11::string::c_str();
    printf(" (%s ms)\n",uVar2);
    std::__cxx11::string::~string(local_30);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Passed()) {
    ColoredPrintf(GTestColor::kGreen, "[       OK ] ");
  } else if (test_info.result()->Skipped()) {
    ColoredPrintf(GTestColor::kGreen, "[  SKIPPED ] ");
  } else {
    ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
  }
  PrintTestName(test_info.test_suite_name(), test_info.name());
  if (test_info.result()->Failed())
    PrintFullTestCommentIfPresent(test_info);

  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms)\n", internal::StreamableToString(
           test_info.result()->elapsed_time()).c_str());
  } else {
    printf("\n");
  }
  fflush(stdout);
}